

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::resetPoolNoFlagsTest(TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk_00;
  Handle<(vk::HandleType)24> *pHVar1;
  allocator<char> local_e1;
  string local_e0;
  deUint64 local_c0;
  Move<vk::Handle<(vk::HandleType)24>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  Context::getUniversalQueueFamilyIndex(context);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  ::vk::createCommandPool
            (&local_a8,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface = local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator = local_88.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_a8);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_68);
  local_c0 = pHVar1->m_internal;
  result = (*vk_00->_vptr_DeviceInterface[0x46])(vk_00,device,local_c0,0);
  ::vk::checkResult(result,"vk.resetCommandPool(vkDevice, *cmdPool, 0u)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x24c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Command Pool allocated correctly.",&local_e1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus resetPoolNoFlagsTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		0u,															// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams, DE_NULL));

	VK_CHECK(vk.resetCommandPool(vkDevice, *cmdPool, 0u));

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}